

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_37bab4::MLDSATest_KeyGenTests87_Test::TestBody
          (MLDSATest_KeyGenTests87_Test *this)

{
  function<void_(FileTest_*)> local_30;
  MLDSATest_KeyGenTests87_Test *local_10;
  MLDSATest_KeyGenTests87_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::function<void(&)(FileTest*),void>
            ((function<void(FileTest*)> *)&local_30,
             MLDSAKeyGenTest<BCM_mldsa87_private_key,_2592UL,_&BCM_mldsa87_generate_key_external_entropy,_&BCM_mldsa87_marshal_private_key>
            );
  FileTestGTest("crypto/mldsa/mldsa_nist_keygen_87_tests.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(MLDSATest, KeyGenTests87) {
  FileTestGTest(
      "crypto/mldsa/mldsa_nist_keygen_87_tests.txt",
      MLDSAKeyGenTest<BCM_mldsa87_private_key, BCM_MLDSA87_PUBLIC_KEY_BYTES,
                      BCM_mldsa87_generate_key_external_entropy,
                      BCM_mldsa87_marshal_private_key>);
}